

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O1

uint32 heap64b_ins(float64 *a,uint32 *k,uint32 sz,float64 a_v,uint32 k_v,hcmpfn64b_t cmp)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)sz;
  uVar3 = sz;
  if (sz != 0) {
    do {
      uVar1 = uVar3 - 1;
      uVar4 = uVar1 >> 1;
      uVar5 = (ulong)uVar4;
      iVar2 = (*cmp)(a[uVar5],a_v);
      if (iVar2 != 0) {
        uVar5 = (ulong)uVar3;
        break;
      }
      a[uVar3] = a[uVar5];
      k[uVar3] = k[uVar5];
      uVar3 = uVar4;
    } while (1 < uVar1);
  }
  a[uVar5] = a_v;
  k[uVar5] = k_v;
  return sz + 1;
}

Assistant:

uint32
heap64b_ins(float64 *a,  uint32 *k, uint32 sz,
	    float64 a_v, uint32 k_v,
	    hcmpfn64b_t cmp)
{
    uint32 i, p;

    ++sz;

    i = sz-1;
    p = PARENT(i);
    /* if the parent does not satisfy the ordering,
     * then switch with i */
    while ((i > 0) && !cmp(a[p], a_v)) {
	a[i] = a[p];
	k[i] = k[p];
	i = p;
	p = PARENT(p);
    }
    a[i] = a_v;
    k[i] = k_v;

    return sz;
}